

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O1

void __thiscall cmCTestBuildCommand::~cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  pointer ppcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestBuildCommand_006a2e00;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_006a2ff8;
  ppcVar1 = (this->super_cmCTestHandlerCommand).Values.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->super_cmCTestHandlerCommand).Values.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1)
    ;
  }
  ppcVar1 = (this->super_cmCTestHandlerCommand).Arguments.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->super_cmCTestHandlerCommand).Arguments.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1)
    ;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).ReturnVariable._M_dataplus._M_p;
  paVar3 = &(this->super_cmCTestHandlerCommand).ReturnVariable.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_006a4bd8;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Error.
           _M_dataplus._M_p;
  paVar3 = &(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCTestBuildCommand::~cmCTestBuildCommand()
{
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    this->GlobalGenerator = nullptr;
  }
}